

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O1

void __thiscall Imf_3_4::Image::insertChannel(Image *this,string *name,Channel *channel)

{
  insertChannel(this,name,*(PixelType *)channel,*(int *)(channel + 4),*(int *)(channel + 8),
                (bool)channel[0xc]);
  return;
}

Assistant:

void
Image::insertChannel (const string& name, const Channel& channel)
{
    insertChannel (
        name,
        channel.type,
        channel.xSampling,
        channel.ySampling,
        channel.pLinear);
}